

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

size_t absl::lts_20240722::debugging_internal::StrLen(char *str)

{
  undefined8 local_18;
  size_t len;
  char *str_local;
  
  local_18 = 0;
  for (len = (size_t)str; *(char *)len != '\0'; len = len + 1) {
    local_18 = local_18 + 1;
  }
  return local_18;
}

Assistant:

static size_t StrLen(const char *str) {
  size_t len = 0;
  while (*str != '\0') {
    ++str;
    ++len;
  }
  return len;
}